

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

Vec_Wec_t *
Acec_ManCollectCarryRootSets
          (Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,Vec_Int_t *vXors,Vec_Int_t *vXorRoots,
          Vec_Int_t *vCarryRoots)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Bit_t *vIsCarryRoot;
  int *__s;
  Vec_Int_t *vXorSet;
  int *piVar6;
  Gia_Man_t *p_01;
  Vec_Int_t *pVVar7;
  uint *__ptr;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  Gia_Man_t *p_02;
  size_t sVar15;
  long lVar16;
  
  p_00 = (Gia_Man_t *)malloc(0x10);
  p_00->pName = (char *)0x64;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pSpec = (char *)pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  uVar1 = p->nObjs;
  iVar11 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  vIsCarryRoot = (Vec_Bit_t *)malloc(0x10);
  iVar8 = iVar11 * 0x20;
  vIsCarryRoot->nCap = iVar8;
  if (iVar11 == 0) {
    sVar12 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar12 = (long)iVar11 << 2;
    __s = (int *)malloc(sVar12);
  }
  vIsCarryRoot->pArray = __s;
  vIsCarryRoot->nSize = iVar8;
  memset(__s,0,sVar12);
  vXorSet = (Vec_Int_t *)malloc(0x10);
  vXorSet->nCap = 100;
  piVar6 = (int *)malloc(400);
  vXorSet->pArray = piVar6;
  p_01 = (Gia_Man_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  *(uint *)&p_01->pName = uVar9;
  if (uVar9 == 0) {
    p_01->pSpec = (char *)0x0;
    *(uint *)((long)&p_01->pName + 4) = uVar1;
LAB_00670167:
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    p_01->pSpec = (char *)piVar6;
    *(uint *)((long)&p_01->pName + 4) = uVar1;
    if (piVar6 == (int *)0x0) goto LAB_00670167;
    memset(piVar6,0xff,(long)(int)uVar1 << 2);
  }
  iVar11 = vXors->nSize;
  if (0 < iVar11) {
    piVar3 = vXors->pArray;
    uVar10 = 0;
    iVar13 = 0;
    do {
      iVar2 = piVar3[uVar10];
      if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar6[iVar2] = iVar13;
      iVar13 = iVar13 + 1;
      uVar9 = (int)uVar10 + 4;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < iVar11);
  }
  iVar11 = vCarryRoots->nSize;
  if (0 < (long)iVar11) {
    piVar3 = vCarryRoots->pArray;
    lVar14 = 0;
    do {
      uVar1 = piVar3[lVar14];
      if (((int)uVar1 < 0) || (iVar8 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      lVar14 = lVar14 + 1;
    } while (iVar11 != lVar14);
  }
  if (0 < vXorRoots->nSize) {
    lVar14 = 0;
    do {
      iVar11 = vXorRoots->pArray[lVar14];
      vXorSet->nSize = 0;
      pVVar4->nSize = 0;
      Gia_ManIncrementTravId(p);
      p_02 = p;
      Acec_ManCountXorTreeInputs_rec(p,iVar11,vXors,(Vec_Int_t *)p_01,vIsCarryRoot,pVVar4,vXorSet);
      iVar11 = pVVar4->nSize;
      sVar12 = (size_t)iVar11;
      sVar15 = 0;
      if ((long)sVar12 < 1) {
LAB_006702bb:
        if ((int)sVar15 != iVar11) {
          piVar5 = pVVar4->pArray;
          qsort(piVar5,sVar12,4,Vec_IntSortCompare1);
          pVVar7 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
          iVar13 = vXorSet->nSize;
          if (0 < (long)iVar13) {
            piVar3 = vXorSet->pArray;
            lVar16 = 0;
            do {
              Vec_IntPush(pVVar7,piVar3[lVar16]);
              lVar16 = lVar16 + 1;
            } while (iVar13 != lVar16);
          }
          pVVar7 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
          if (iVar11 < 1) {
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
          }
          else {
            sVar15 = 0;
            do {
              Vec_IntPush(pVVar7,piVar5[sVar15]);
              sVar15 = sVar15 + 1;
            } while (sVar12 != sVar15);
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
            Vec_WecPushLevel((Vec_Wec_t *)p_00);
            if (0 < iVar11) {
              sVar15 = 0;
              do {
                uVar1 = piVar5[sVar15];
                if (((int)uVar1 < 0) || (iVar8 <= (int)uVar1)) goto LAB_00670567;
                if (((uint)__s[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
                  __assert_fail("Vec_BitEntry(vIsCarryRoot, CarryRoot)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPool.c"
                                ,0x9b,
                                "Vec_Wec_t *Acec_ManCollectCarryRootSets(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                __s[uVar1 >> 5] = __s[uVar1 >> 5] & ~(1 << ((byte)uVar1 & 0x1f));
                sVar15 = sVar15 + 1;
              } while (sVar12 != sVar15);
            }
          }
        }
      }
      else {
        piVar5 = pVVar4->pArray;
        sVar15 = 0;
        do {
          iVar13 = Acec_ManCheckCarryMap(p_02,piVar5[sVar15],vAdds,vCarryMap);
          if (iVar13 != 0) goto LAB_006702bb;
          sVar15 = sVar15 + 1;
        } while (sVar12 != sVar15);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vXorRoots->nSize);
    piVar5 = pVVar4->pArray;
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar4);
  if (vXorSet->pArray != (int *)0x0) {
    free(vXorSet->pArray);
  }
  free(vXorSet);
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(p_01);
  if (vCarryRoots->nSize < 1) {
    if (__s == (int *)0x0) goto LAB_00670548;
  }
  else {
    lVar14 = 0;
    do {
      uVar1 = vCarryRoots->pArray[lVar14];
      if (((int)uVar1 < 0) || (vIsCarryRoot->nSize <= (int)uVar1)) {
LAB_00670567:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((((uint)__s[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) &&
         (iVar8 = Acec_ManCheckCarryMap(p_01,uVar1,vAdds,vCarryMap), iVar8 != 0)) {
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        pVVar4 = Vec_WecPushLevel((Vec_Wec_t *)p_00);
        __ptr = (uint *)pVVar4->pArray;
        if (pVVar4->nCap < 1) {
          if (__ptr == (uint *)0x0) {
            __ptr = (uint *)malloc(4);
          }
          else {
            __ptr = (uint *)realloc(__ptr,4);
          }
          pVVar4->pArray = (int *)__ptr;
          if (__ptr == (uint *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = 1;
        }
        *__ptr = uVar1;
        pVVar4->nSize = 1;
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
        p_01 = p_00;
        Vec_WecPushLevel((Vec_Wec_t *)p_00);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vCarryRoots->nSize);
  }
  free(__s);
LAB_00670548:
  free(vIsCarryRoot);
  return (Vec_Wec_t *)p_00;
}

Assistant:

Vec_Wec_t * Acec_ManCollectCarryRootSets( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vXors, Vec_Int_t * vXorRoots, Vec_Int_t * vCarryRoots )
{
    Vec_Wec_t * vCarryRootSets = Vec_WecAlloc( 100 ); // XorBoxes, CarryRoots, AdderBoxes, Ins/Ranks, Outs/Ranks
    Vec_Int_t * vCarryRootSet = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIsCarryRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vXorSet = Vec_IntAlloc( 100 ), * vLevel;
    int i, k, XorRoot, CarryRoot;
    // map XORs into their cuts
    Vec_Int_t * vXorMap = Vec_IntStartFull( Gia_ManObjNum(p) );  
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_IntWriteEntry( vXorMap, Vec_IntEntry(vXors, 4*i), i );
    // create carry root marks
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, i )
        Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 1 );
    // collect carry roots attached to each XOR root
    Vec_IntForEachEntry( vXorRoots, XorRoot, i )
    {
        Vec_IntClear( vXorSet );
        Vec_IntClear( vCarryRootSet );
        Gia_ManIncrementTravId( p );
        Acec_ManCountXorTreeInputs_rec( p, XorRoot, vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
        // skip trivial
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
            if ( Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
                break;
        if ( k == Vec_IntSize(vCarryRootSet) )
            continue;
        Vec_IntSort( vCarryRootSet, 0 );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vXorSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vCarryRootSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        // unmark carry root set
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
        {
            assert( Vec_BitEntry(vIsCarryRoot, CarryRoot) );
            Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 0 );
        }
    }
    Vec_IntFree( vCarryRootSet );
    Vec_IntFree( vXorSet );
    Vec_IntFree( vXorMap );
    // collect unmarked carry roots
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, k )
    {
        if ( !Vec_BitEntry(vIsCarryRoot, CarryRoot) )
            continue;
        if ( !Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
            continue;
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntFill( vLevel, 1, CarryRoot );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
    }
    Vec_BitFree( vIsCarryRoot );
    return vCarryRootSets;
}